

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::compress_block_internal(lzcompressor *this,void *pBuf,uint buf_len)

{
  undefined4 uVar1;
  lzdecision lzdec;
  lzdecision lzdec_00;
  vector<lzham::lzcompressor::lzdecision> *this_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  ulong uVar6;
  lzdecision *plVar7;
  atomic32_t aVar8;
  vector<unsigned_char> *pvVar9;
  uint uVar10;
  uint in_EDX;
  void *in_RSI;
  lzcompressor *in_RDI;
  scoped_perf_section append_timer;
  uint i_3;
  uint8 *pSrc;
  uint buf_len2;
  uint buf_len1;
  uint buf_len0;
  uint compressed_size;
  scoped_perf_section stop_encoding_timer;
  scoped_perf_section add_bytes_timer_2;
  uint pti_2;
  int dec_step;
  int end_dec_index;
  int i_2;
  uint pti_1;
  vector<lzham::lzcompressor::lzdecision> *best_decisions_1;
  uint pti;
  scoped_perf_section sect;
  parse_thread_state *parse_thread_1;
  uint parse_thread_index_2;
  uint total_bytes_parsed;
  scoped_perf_section coding_timer;
  scoped_perf_section add_bytes_timer_1;
  uint parse_thread_index_1;
  scoped_perf_section queue_task_timer;
  scoped_perf_section parse_timer;
  parse_thread_state *parse_thread;
  uint parse_thread_index;
  state_base saved_state;
  uint parse_thread_remaining;
  uint parse_thread_total_size;
  uint parse_thread_start_ofs;
  uint num_parse_jobs;
  scoped_perf_section add_bytes_timer;
  uint i_1;
  lzdecision *dec;
  uint i;
  uint max_match_len;
  uint total_match_len;
  uint num_small_decisions;
  vector<lzham::lzcompressor::lzdecision> *best_decisions;
  uint num_greedy_decisions_to_code;
  parse_thread_state *greedy_parse_state;
  uint cAvgAcceptableGreedyMatchLen;
  uint initial_step;
  bool emit_reset_update_rate_command;
  uint bytes_to_match;
  uint cur_dict_ofs;
  bool computed_adler32;
  scoped_perf_section compress_block_timer;
  vector<unsigned_char> *in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  search_accelerator *in_stack_fffffffffffffe58;
  lzcompressor *in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  uint in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  int iVar11;
  undefined4 in_stack_fffffffffffffe84;
  search_accelerator *this_01;
  uint in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  byte *local_150;
  scoped_perf_section local_132;
  scoped_perf_section local_131;
  undefined4 in_stack_fffffffffffffed0;
  uint uVar12;
  undefined4 in_stack_fffffffffffffed4;
  int local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_f8;
  scoped_perf_section local_f1;
  parse_thread_state *local_f0;
  uint local_e8;
  uint local_e4;
  scoped_perf_section local_de;
  scoped_perf_section local_dd;
  uint local_dc;
  code *local_d8;
  undefined8 local_d0;
  scoped_perf_section local_c2;
  scoped_perf_section local_c1;
  parse_thread_state *local_c0;
  uint local_b8;
  state_base local_b4;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  scoped_perf_section local_89;
  undefined8 local_88;
  int local_80;
  undefined8 local_78;
  int local_70;
  uint local_6c;
  lzdecision *local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  vector<lzham::lzcompressor::lzdecision> *local_50;
  uint local_44;
  parse_thread_state *local_40;
  undefined4 local_34;
  uint local_30;
  byte local_29;
  uint local_28;
  uint local_24;
  byte local_1e;
  scoped_perf_section local_1d;
  uint local_1c;
  void *local_18;
  bool local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  scoped_perf_section::scoped_perf_section
            (&local_1d,cVarArgs,"****** compress_block %u",(ulong)in_RDI->m_block_index);
  if (in_RDI->m_src_size < 0) {
    local_1 = false;
  }
  else {
    in_RDI->m_src_size = (ulong)local_1c + in_RDI->m_src_size;
    bVar2 = search_accelerator::add_bytes_begin
                      ((search_accelerator *)
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe7c,
                       (uint8 *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    if (bVar2) {
      local_1e = 0;
      state::operator=((state *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (state *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      uVar3 = search_accelerator::get_lookahead_pos(&in_RDI->m_accel);
      uVar4 = search_accelerator::get_max_dict_size(&in_RDI->m_accel);
      in_RDI->m_block_start_dict_ofs = uVar3 & uVar4 - 1;
      local_24 = in_RDI->m_block_start_dict_ofs;
      local_28 = local_1c;
      uVar6 = lzham::symbol_codec::start_encoding((int)in_RDI + 0x478);
      if ((uVar6 & 1) == 0) {
        local_1 = false;
      }
      else {
        uVar1 = in_stack_fffffffffffffed4;
        if ((in_RDI->m_block_index != 0) ||
           (bVar2 = send_configuration(in_RDI), uVar1 = in_stack_fffffffffffffed4, bVar2)) {
          uVar6 = lzham::symbol_codec::encode_bits((int)in_RDI + 0x478,1);
          if ((uVar6 & 1) == 0) {
            local_1 = false;
          }
          else {
            uVar6 = lzham::symbol_codec::encode_arith_init();
            if ((uVar6 & 1) == 0) {
              local_1 = false;
            }
            else {
              state::start_of_block
                        ((state *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
              local_29 = 0;
              if (((in_RDI->m_params).m_lzham_compress_flags & 0x10) != 0) {
                local_29 = 1;
                state::reset_update_rate
                          ((state *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
              }
              lzham::symbol_codec::encode_bits((int)in_RDI + 0x478,(uint)((local_29 & 1) != 0));
              this_01 = (search_accelerator *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
              local_30 = in_RDI->m_step;
              while (local_28 != 0) {
                local_34 = 0x180;
                if (((in_RDI->m_params).m_pSeed_bytes == (void *)0x0) || (local_28 < 0x180)) {
LAB_00113622:
                  in_stack_fffffffffffffe7c = in_RDI->m_num_parse_threads;
                  if (in_stack_fffffffffffffe7c < (local_28 + 0xbff) / 0xc00) {
                    in_stack_fffffffffffffe78 = in_RDI->m_num_parse_threads;
                  }
                  else {
                    in_stack_fffffffffffffe78 = (local_28 + 0xbff) / 0xc00;
                  }
                  local_90 = in_stack_fffffffffffffe78;
                  if (((((in_RDI->m_params).m_lzham_compress_flags & 4) == 0) &&
                      ((in_RDI->m_use_task_pool & 1U) != 0)) &&
                     (uVar4 = search_accelerator::get_max_helper_threads(&in_RDI->m_accel),
                     uVar4 != 0)) {
                    aVar8 = search_accelerator::get_num_completed_helper_threads(&in_RDI->m_accel);
                    in_stack_fffffffffffffe74 = local_90 + (int)aVar8;
                    local_90 = in_stack_fffffffffffffe74;
                    if (7 < in_stack_fffffffffffffe74) {
                      in_stack_fffffffffffffe74 = 8;
                      local_90 = in_stack_fffffffffffffe74;
                    }
                  }
                  if ((local_28 < 0x600) ||
                     (((in_RDI->m_params).m_lzham_compress_flags & 0x40) != 0)) {
                    local_90 = 1;
                  }
                  if ((in_RDI->m_block_index == 0) &&
                     (local_24 - in_RDI->m_block_start_dict_ofs < 0x3000)) {
                    local_90 = 1;
                  }
                  local_94 = local_24;
                  uVar4 = local_28;
                  if (local_90 * 0xc00 <= local_28) {
                    uVar4 = local_90 * 0xc00;
                  }
                  local_9c = uVar4;
                  local_98 = uVar4;
                  if (local_90 == 1) {
                    state_base::save_partial_state(&(in_RDI->m_state).super_state_base,&local_b4);
                  }
                  for (local_b8 = 0; local_b8 < local_90; local_b8 = local_b8 + 1) {
                    local_c0 = in_RDI->m_parse_thread_state + local_b8;
                    if (local_90 == 1) {
                      (local_c0->super_raw_parse_thread_state).m_pState = &in_RDI->m_state;
                      uVar12 = in_stack_fffffffffffffe68;
                    }
                    else {
                      (local_c0->super_raw_parse_thread_state).m_pState =
                           &(local_c0->super_raw_parse_thread_state).m_state;
                      state::operator=((state *)CONCAT44(in_stack_fffffffffffffe94,
                                                         in_stack_fffffffffffffe90),
                                       (state *)CONCAT44(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88));
                      uVar12 = in_stack_fffffffffffffe68;
                    }
                    (((local_c0->super_raw_parse_thread_state).m_pState)->super_state_base).
                    m_cur_ofs = local_94;
                    if (local_b8 == 0) {
                      (local_c0->super_raw_parse_thread_state).m_issue_reset_state_partial = false;
                    }
                    else {
                      state::reset_state_partial((local_c0->super_raw_parse_thread_state).m_pState);
                      (local_c0->super_raw_parse_thread_state).m_issue_reset_state_partial = true;
                    }
                    (local_c0->super_raw_parse_thread_state).m_start_ofs = local_94;
                    if (local_b8 == local_90 - 1) {
                      (local_c0->super_raw_parse_thread_state).m_bytes_to_match = local_9c;
                    }
                    else {
                      (local_c0->super_raw_parse_thread_state).m_bytes_to_match =
                           local_98 / local_90;
                    }
                    if ((local_c0->super_raw_parse_thread_state).m_bytes_to_match < 0xc00) {
                      in_stack_fffffffffffffe6c =
                           (local_c0->super_raw_parse_thread_state).m_bytes_to_match;
                    }
                    else {
                      in_stack_fffffffffffffe6c = 0xc00;
                    }
                    (local_c0->super_raw_parse_thread_state).m_bytes_to_match =
                         in_stack_fffffffffffffe6c;
                    (local_c0->super_raw_parse_thread_state).m_max_parse_node_states =
                         (in_RDI->m_params).m_extreme_parsing_max_best_arrivals;
                    (local_c0->super_raw_parse_thread_state).m_max_greedy_decisions = 0xffffffff;
                    (local_c0->super_raw_parse_thread_state).m_greedy_parse_gave_up = false;
                    (local_c0->super_raw_parse_thread_state).m_parse_early_out_thresh = 0xffffffff;
                    (local_c0->super_raw_parse_thread_state).m_bytes_actually_parsed = 0;
                    in_stack_fffffffffffffe68 = uVar12 & 0xffffff;
                    if (((in_RDI->m_use_task_pool & 1U) != 0) &&
                       (in_stack_fffffffffffffe68 = uVar12 & 0xffffff, 1 < local_90)) {
                      in_stack_fffffffffffffe68 = CONCAT13(local_b8 != 0,(int3)uVar12);
                    }
                    (local_c0->super_raw_parse_thread_state).m_use_semaphore =
                         SUB41(in_stack_fffffffffffffe68 >> 0x18,0);
                    if (((in_RDI->m_params).m_compression_level == cCompressionLevelUber) &&
                       (local_90 == 1)) {
                      uVar10 = 0x40;
                      if (((in_RDI->m_params).m_lzham_compress_flags & 2) != 0) {
                        uVar10 = 0x10;
                      }
                      (local_c0->super_raw_parse_thread_state).m_parse_early_out_thresh = uVar10;
                    }
                    local_94 = (local_c0->super_raw_parse_thread_state).m_bytes_to_match + local_94;
                    local_9c = local_9c - (local_c0->super_raw_parse_thread_state).m_bytes_to_match;
                  }
                  scoped_perf_section::scoped_perf_section(&local_c1,"parsing");
                  if (((in_RDI->m_use_task_pool & 1U) == 0) || (local_90 < 2)) {
                    for (local_dc = 0; local_dc < local_90; local_dc = local_dc + 1) {
                      parse_job_callback((lzcompressor *)CONCAT44(in_stack_fffffffffffffe74,uVar4),
                                         CONCAT44(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68),
                                         in_stack_fffffffffffffe60);
                    }
                  }
                  else {
                    scoped_perf_section::scoped_perf_section(&local_c2,"queuing parse tasks");
                    local_d8 = parse_job_callback;
                    local_d0 = 0;
                    in_stack_fffffffffffffe48 = (vector<unsigned_char> *)0x0;
                    bVar2 = task_pool::
                            queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
                                      ((task_pool *)
                                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                                       ,in_RDI,CONCAT44(in_stack_fffffffffffffe94,
                                                        in_stack_fffffffffffffe90),
                                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                                       ,(uint)((ulong)this_01 >> 0x20),
                                       (void *)CONCAT44(uVar1,in_stack_fffffffffffffed0));
                    if (!bVar2) {
                      return false;
                    }
                    parse_job_callback((lzcompressor *)CONCAT44(in_stack_fffffffffffffe74,uVar4),
                                       CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                                       ,in_stack_fffffffffffffe60);
                  }
                  if (local_90 == 1) {
                    state_base::restore_partial_state(&(in_RDI->m_state).super_state_base,&local_b4)
                    ;
                  }
                  if ((local_1e & 1) == 0) {
                    local_1e = 1;
                    scoped_perf_section::scoped_perf_section(&local_dd,"adler32");
                    uVar5 = lzham::adler32(local_18,(ulong)local_1c,in_RDI->m_src_adler32);
                    in_RDI->m_src_adler32 = uVar5;
                  }
                  scoped_perf_section::scoped_perf_section(&local_de,"coding");
                  local_e4 = 0;
                  for (local_e8 = 0; local_e8 < local_90; local_e8 = local_e8 + 1) {
                    local_f0 = in_RDI->m_parse_thread_state + local_e8;
                    if (((local_f0->super_raw_parse_thread_state).m_use_semaphore & 1U) != 0) {
                      scoped_perf_section::scoped_perf_section
                                (&local_f1,cVarArgs,"Waiting for parser %u",(ulong)local_e8);
                      semaphore::wait(&in_RDI->m_parse_thread_state[local_e8].
                                       super_raw_parse_thread_state.m_finished,(void *)0xffffffff);
                      in_RDI->m_parse_thread_state[local_e8].super_raw_parse_thread_state.
                      m_use_semaphore = false;
                    }
                    if (((local_f0->super_raw_parse_thread_state).m_failed & 1U) != 0) {
                      for (local_f8 = 1; local_f8 < local_90; local_f8 = local_f8 + 1) {
                        if ((in_RDI->m_parse_thread_state[local_f8].super_raw_parse_thread_state.
                             m_use_semaphore & 1U) != 0) {
                          semaphore::wait(&in_RDI->m_parse_thread_state[local_f8].
                                           super_raw_parse_thread_state.m_finished,
                                          (void *)0xffffffff);
                          in_RDI->m_parse_thread_state[local_f8].super_raw_parse_thread_state.
                          m_use_semaphore = false;
                        }
                      }
                      return false;
                    }
                    this_00 = &(local_f0->super_raw_parse_thread_state).m_best_decisions;
                    if (((local_f0->super_raw_parse_thread_state).m_issue_reset_state_partial & 1U)
                        != 0) {
                      bVar2 = state::encode_reset_state_partial
                                        ((state *)CONCAT44(in_stack_fffffffffffffe6c,
                                                           in_stack_fffffffffffffe68),
                                         (symbol_codec *)in_stack_fffffffffffffe60,
                                         in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
                      if (!bVar2) {
                        for (local_104 = 1; local_104 < local_90; local_104 = local_104 + 1) {
                          if ((in_RDI->m_parse_thread_state[local_104].super_raw_parse_thread_state.
                               m_use_semaphore & 1U) != 0) {
                            semaphore::wait(&in_RDI->m_parse_thread_state[local_104].
                                             super_raw_parse_thread_state.m_finished,
                                            (void *)0xffffffff);
                            in_RDI->m_parse_thread_state[local_104].super_raw_parse_thread_state.
                            m_use_semaphore = false;
                          }
                        }
                        return false;
                      }
                      in_RDI->m_step = in_RDI->m_step + 1;
                    }
                    uVar4 = vector<lzham::lzcompressor::lzdecision>::size(this_00);
                    if (uVar4 != 0) {
                      local_108 = 0;
                      local_10c = vector<lzham::lzcompressor::lzdecision>::size(this_00);
                      local_10c = local_10c - 1;
                      local_110 = 1;
                      if (((local_f0->super_raw_parse_thread_state).m_emit_decisions_backwards & 1U)
                          != 0) {
                        local_108 = vector<lzham::lzcompressor::lzdecision>::size(this_00);
                        local_108 = local_108 - 1;
                        local_10c = 0;
                        local_110 = -1;
                      }
                      while( true ) {
                        plVar7 = vector<lzham::lzcompressor::lzdecision>::operator[]
                                           (this_00,local_108);
                        uVar1 = plVar7->m_pos;
                        lzdec_00.m_len = in_stack_fffffffffffffe7c;
                        lzdec_00.m_pos = in_stack_fffffffffffffe78;
                        lzdec_00.m_dist = (int)this_01;
                        bVar2 = code_decision(in_stack_fffffffffffffe60,lzdec_00,
                                              (uint *)in_stack_fffffffffffffe58,
                                              (uint *)CONCAT44(in_stack_fffffffffffffe54,
                                                               in_stack_fffffffffffffe50));
                        if (!bVar2) {
                          for (uVar12 = 1; uVar12 < local_90; uVar12 = uVar12 + 1) {
                            if ((in_RDI->m_parse_thread_state[uVar12].super_raw_parse_thread_state.
                                 m_use_semaphore & 1U) != 0) {
                              semaphore::wait(&in_RDI->m_parse_thread_state[uVar12].
                                               super_raw_parse_thread_state.m_finished,
                                              (void *)0xffffffff);
                              in_RDI->m_parse_thread_state[uVar12].super_raw_parse_thread_state.
                              m_use_semaphore = false;
                            }
                          }
                          return false;
                        }
                        vector<lzham::lzcompressor::lzdecision>::operator[](this_00,local_108);
                        uVar4 = lzdecision::get_len((lzdecision *)0x1140bd);
                        local_e4 = uVar4 + local_e4;
                        if (local_108 == local_10c) break;
                        local_108 = local_110 + local_108;
                      }
                    }
                  }
                  search_accelerator::advance_bytes(&in_RDI->m_accel,local_e4);
                }
                else {
                  local_40 = in_RDI->m_parse_thread_state + 8;
                  in_RDI->m_parse_thread_state[8].super_raw_parse_thread_state.m_pState =
                       &in_RDI->m_parse_thread_state[8].super_raw_parse_thread_state.m_state;
                  state::operator=((state *)CONCAT44(in_stack_fffffffffffffe94,
                                                     in_stack_fffffffffffffe90),
                                   (state *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88));
                  (local_40->super_raw_parse_thread_state).m_state.super_state_base.m_cur_ofs =
                       local_24;
                  (local_40->super_raw_parse_thread_state).m_issue_reset_state_partial = false;
                  (local_40->super_raw_parse_thread_state).m_start_ofs = local_24;
                  uVar4 = local_28;
                  if (0xffff < local_28) {
                    uVar4 = 0x10000;
                  }
                  (local_40->super_raw_parse_thread_state).m_bytes_to_match = uVar4;
                  if (local_28 / 0x180 < 2) {
                    in_stack_fffffffffffffe94 = 2;
                  }
                  else {
                    in_stack_fffffffffffffe94 = local_28 / 0x180;
                  }
                  (local_40->super_raw_parse_thread_state).m_max_greedy_decisions =
                       in_stack_fffffffffffffe94;
                  (local_40->super_raw_parse_thread_state).m_greedy_parse_gave_up = false;
                  (local_40->super_raw_parse_thread_state).m_greedy_parse_total_bytes_coded = 0;
                  (local_40->super_raw_parse_thread_state).m_parse_early_out_thresh = 0xffffffff;
                  (local_40->super_raw_parse_thread_state).m_bytes_actually_parsed = 0;
                  (local_40->super_raw_parse_thread_state).m_use_semaphore = false;
                  bVar2 = greedy_parse((lzcompressor *)CONCAT44(uVar3,uVar4),
                                       (parse_thread_state *)
                                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                                      );
                  if ((!bVar2) &&
                     (((local_40->super_raw_parse_thread_state).m_greedy_parse_gave_up & 1U) == 0))
                  {
                    return false;
                  }
                  local_44 = 0;
                  local_50 = &(local_40->super_raw_parse_thread_state).m_best_decisions;
                  if (((local_40->super_raw_parse_thread_state).m_greedy_parse_gave_up & 1U) == 0) {
                    local_44 = vector<lzham::lzcompressor::lzdecision>::size(local_50);
                  }
                  else {
                    local_54 = 0;
                    local_58 = 0;
                    local_5c = 0;
                    local_60 = 0;
                    while (in_stack_fffffffffffffe90 = local_60,
                          uVar4 = vector<lzham::lzcompressor::lzdecision>::size(local_50),
                          in_stack_fffffffffffffe90 < uVar4) {
                      local_68 = vector<lzham::lzcompressor::lzdecision>::operator[]
                                           (local_50,local_60);
                      uVar4 = lzdecision::get_len((lzdecision *)0x1133de);
                      if ((uVar4 < 0x102) && (local_54 = local_54 + 1, 0x10 < local_54)) break;
                      uVar4 = lzdecision::get_len((lzdecision *)0x113411);
                      local_58 = uVar4 + local_58;
                      in_stack_fffffffffffffe8c = local_5c;
                      uVar4 = lzdecision::get_len((lzdecision *)0x113437);
                      if (in_stack_fffffffffffffe8c < uVar4) {
                        local_5c = lzdecision::get_len((lzdecision *)0x11344e);
                      }
                      local_60 = local_60 + 1;
                      in_stack_fffffffffffffe88 = local_5c;
                    }
                    if ((0x101 < local_5c) && (0x17f < local_58 / local_60)) {
                      local_44 = local_60;
                    }
                  }
                  if (local_44 == 0) goto LAB_00113622;
                  for (local_6c = 0; iVar11 = (int)this_01, local_6c < local_44;
                      local_6c = local_6c + 1) {
                    plVar7 = vector<lzham::lzcompressor::lzdecision>::operator[](local_50,local_6c);
                    local_88._0_4_ = plVar7->m_pos;
                    local_88._4_4_ = plVar7->m_len;
                    local_80 = plVar7->m_dist;
                    lzdec.m_len = in_stack_fffffffffffffe7c;
                    lzdec.m_pos = in_stack_fffffffffffffe78;
                    lzdec.m_dist = iVar11;
                    local_78 = local_88;
                    local_70 = local_80;
                    bVar2 = code_decision(in_stack_fffffffffffffe60,lzdec,
                                          (uint *)in_stack_fffffffffffffe58,
                                          (uint *)CONCAT44(in_stack_fffffffffffffe54,
                                                           in_stack_fffffffffffffe50));
                    if (!bVar2) {
                      return false;
                    }
                    this_01 = &in_RDI->m_accel;
                    vector<lzham::lzcompressor::lzdecision>::operator[](local_50,local_6c);
                    uVar4 = lzdecision::get_len((lzdecision *)0x11358e);
                    search_accelerator::advance_bytes(this_01,uVar4);
                  }
                  if ((((local_40->super_raw_parse_thread_state).m_greedy_parse_gave_up & 1U) != 0)
                     && (local_28 != 0)) goto LAB_00113622;
                  if ((local_1e & 1) == 0) {
                    local_1e = 1;
                    scoped_perf_section::scoped_perf_section(&local_89,"adler32");
                    uVar5 = lzham::adler32(local_18,(ulong)local_1c,in_RDI->m_src_adler32);
                    in_RDI->m_src_adler32 = uVar5;
                  }
                }
              }
              scoped_perf_section::scoped_perf_section(&local_131,"add_bytes_end");
              search_accelerator::add_bytes_end
                        ((search_accelerator *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
              bVar2 = state::encode_eob((state *)CONCAT44(in_stack_fffffffffffffe6c,
                                                          in_stack_fffffffffffffe68),
                                        (symbol_codec *)in_stack_fffffffffffffe60,
                                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
              if (bVar2) {
                scoped_perf_section::scoped_perf_section(&local_132,"stop_encoding");
                uVar6 = lzham::symbol_codec::stop_encoding((bool)((char)in_RDI + 'x'));
                if ((uVar6 & 1) == 0) {
                  local_1 = false;
                }
                else {
                  pvVar9 = symbol_codec::get_encoding_buf(&in_RDI->m_codec);
                  uVar3 = vector<unsigned_char>::size(pvVar9);
                  if (local_1c <= uVar3) {
                    state::operator=((state *)CONCAT44(in_stack_fffffffffffffe94,
                                                       in_stack_fffffffffffffe90),
                                     (state *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88));
                    in_RDI->m_step = local_30;
                    lzham::symbol_codec::reset();
                    uVar6 = lzham::symbol_codec::start_encoding((int)in_RDI + 0x478);
                    if ((uVar6 & 1) == 0) {
                      return false;
                    }
                    if ((in_RDI->m_block_index == 0) && (bVar2 = send_configuration(in_RDI), !bVar2)
                       ) {
                      return false;
                    }
                    uVar6 = lzham::symbol_codec::encode_bits((int)in_RDI + 0x478,2);
                    if ((uVar6 & 1) == 0) {
                      return false;
                    }
                    uVar6 = lzham::symbol_codec::encode_bits((int)in_RDI + 0x478,local_1c - 1);
                    if ((uVar6 & 1) == 0) {
                      return false;
                    }
                    uVar6 = lzham::symbol_codec::encode_bits
                                      ((int)in_RDI + 0x478,
                                       local_1c - 1 & 0xff ^ local_1c - 1 >> 8 & 0xff ^
                                       local_1c - 1 >> 0x10 & 0xff);
                    if ((uVar6 & 1) == 0) {
                      return false;
                    }
                    uVar6 = lzham::symbol_codec::encode_align_to_byte();
                    if ((uVar6 & 1) == 0) {
                      return false;
                    }
                    local_150 = search_accelerator::get_ptr
                                          ((search_accelerator *)
                                           CONCAT44(in_stack_fffffffffffffe54,
                                                    in_stack_fffffffffffffe50),
                                           (uint)((ulong)in_stack_fffffffffffffe48 >> 0x20));
                    for (uVar12 = 0; uVar12 < local_1c; uVar12 = uVar12 + 1) {
                      uVar6 = lzham::symbol_codec::encode_bits((int)in_RDI + 0x478,(uint)*local_150)
                      ;
                      if ((uVar6 & 1) == 0) {
                        return false;
                      }
                      local_150 = local_150 + 1;
                    }
                    uVar6 = lzham::symbol_codec::stop_encoding((bool)((char)in_RDI + 'x'));
                    if ((uVar6 & 1) == 0) {
                      return false;
                    }
                    local_29 = 0;
                  }
                  scoped_perf_section::scoped_perf_section
                            ((scoped_perf_section *)&stack0xfffffffffffffeab,"append");
                  bVar2 = vector<unsigned_char>::empty(&in_RDI->m_comp_buf);
                  if (bVar2) {
                    symbol_codec::get_encoding_buf(&in_RDI->m_codec);
                    vector<unsigned_char>::swap
                              ((vector<unsigned_char> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe48);
                  }
                  else {
                    pvVar9 = &in_RDI->m_comp_buf;
                    symbol_codec::get_encoding_buf(&in_RDI->m_codec);
                    bVar2 = vector<unsigned_char>::append
                                      (pvVar9,(vector<unsigned_char> *)
                                              CONCAT44(in_stack_fffffffffffffe54,
                                                       in_stack_fffffffffffffe50));
                    if (!bVar2) {
                      return false;
                    }
                  }
                  in_RDI->m_block_index = in_RDI->m_block_index + 1;
                  local_1 = true;
                }
              }
              else {
                local_1 = false;
              }
            }
          }
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool lzcompressor::compress_block_internal(const void* pBuf, uint buf_len)
   {
      scoped_perf_section compress_block_timer(cVarArgs, "****** compress_block %u", m_block_index);

      LZHAM_ASSERT(pBuf);
      LZHAM_ASSERT(buf_len <= m_params.m_block_size);

      LZHAM_ASSERT(m_src_size >= 0);
      if (m_src_size < 0)
         return false;

      m_src_size += buf_len;

      // Important: Don't do any expensive work until after add_bytes_begin() is called, to increase parallelism.
      if (!m_accel.add_bytes_begin(buf_len, static_cast<const uint8*>(pBuf)))
      {
         LZHAM_LOG_ERROR(7047);
         return false;
      }

      bool computed_adler32 = false;

      m_start_of_block_state = m_state;

      m_block_start_dict_ofs = m_accel.get_lookahead_pos() & (m_accel.get_max_dict_size() - 1);

      uint cur_dict_ofs = m_block_start_dict_ofs;

      uint bytes_to_match = buf_len;

      if (!m_codec.start_encoding((buf_len * 9) / 8))
      {
         LZHAM_LOG_ERROR(7048);
         return false;
      }

      if (!m_block_index)
      {
         if (!send_configuration())
         {
            LZHAM_LOG_ERROR(7049);
            return false;
         }
      }

#ifdef LZHAM_LZDEBUG
      m_codec.encode_bits(166, 12);
#endif

      if (!m_codec.encode_bits(cCompBlock, cBlockHeaderBits))
      {
         LZHAM_LOG_ERROR(7050);
         return false;
      }

      if (!m_codec.encode_arith_init())
      {
         LZHAM_LOG_ERROR(7051);
         return false;
      }

      m_state.start_of_block(m_accel, cur_dict_ofs, m_block_index);

      bool emit_reset_update_rate_command = false;

      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_TRADEOFF_DECOMPRESSION_RATE_FOR_COMP_RATIO)
      {
         emit_reset_update_rate_command = true;

         m_state.reset_update_rate();
      }

      // TODO: We could also issue a full huff/arith table reset (code 2), and see if that actually improves the block's compression.
      m_codec.encode_bits(emit_reset_update_rate_command ? 1 : 0, cBlockFlushTypeBits);

      //coding_stats initial_stats(m_stats);

      uint initial_step = m_step;

      while (bytes_to_match)
      {
         const uint cAvgAcceptableGreedyMatchLen = 384;
         if ((m_params.m_pSeed_bytes) && (bytes_to_match >= cAvgAcceptableGreedyMatchLen))
         {
            parse_thread_state &greedy_parse_state = m_parse_thread_state[cMaxParseThreads];

            greedy_parse_state.m_pState = &greedy_parse_state.m_state;
            greedy_parse_state.m_state = m_state;
            greedy_parse_state.m_state.m_cur_ofs = cur_dict_ofs;

            greedy_parse_state.m_issue_reset_state_partial = false;
            greedy_parse_state.m_start_ofs = cur_dict_ofs;
            greedy_parse_state.m_bytes_to_match = LZHAM_MIN(bytes_to_match, static_cast<uint>(CLZBase::cMaxHugeMatchLen));

            greedy_parse_state.m_max_greedy_decisions = LZHAM_MAX((bytes_to_match / cAvgAcceptableGreedyMatchLen), 2);
            greedy_parse_state.m_greedy_parse_gave_up = false;
            greedy_parse_state.m_greedy_parse_total_bytes_coded = 0;

            greedy_parse_state.m_parse_early_out_thresh = UINT_MAX;
            greedy_parse_state.m_bytes_actually_parsed = 0;

            greedy_parse_state.m_use_semaphore = false;

            if (!greedy_parse(greedy_parse_state))
            {
               if (!greedy_parse_state.m_greedy_parse_gave_up)
               {
                  LZHAM_LOG_ERROR(7052);
                  return false;
               }
            }

            uint num_greedy_decisions_to_code = 0;

            const lzham::vector<lzdecision> &best_decisions = greedy_parse_state.m_best_decisions;

            if (!greedy_parse_state.m_greedy_parse_gave_up)
               num_greedy_decisions_to_code = best_decisions.size();
            else
            {
               uint num_small_decisions = 0;
               uint total_match_len = 0;
               uint max_match_len = 0;

               uint i;
               for (i = 0; i < best_decisions.size(); i++)
               {
                  const lzdecision &dec = best_decisions[i];
                  if (dec.get_len() <= CLZBase::cMaxMatchLen)
                  {
                     num_small_decisions++;
                     if (num_small_decisions > 16)
                        break;
                  }

                  total_match_len += dec.get_len();
                  max_match_len = LZHAM_MAX(max_match_len, dec.get_len());
               }

               if (max_match_len > CLZBase::cMaxMatchLen)
               {
                  if ((total_match_len / i) >= cAvgAcceptableGreedyMatchLen)
                  {
                     num_greedy_decisions_to_code = i;
                  }
               }
            }

            if (num_greedy_decisions_to_code)
            {
               for (uint i = 0; i < num_greedy_decisions_to_code; i++)
               {
                  LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                  //LZHAM_ASSERT(i >= 0);
                  LZHAM_ASSERT(i < best_decisions.size());

#if LZHAM_UPDATE_STATS
                  bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                  m_stats.update(best_decisions[i], m_state, m_accel, cost);
#endif

                  if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                  {
                     LZHAM_LOG_ERROR(7053);
                     return false;
                  }

                  m_accel.advance_bytes(best_decisions[i].get_len());
               }

               if ((!greedy_parse_state.m_greedy_parse_gave_up) || (!bytes_to_match))
			   {
				   if (!computed_adler32)
				   {
					   computed_adler32 = true;

					   scoped_perf_section add_bytes_timer("adler32");
					   m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);
				   }

                  continue;
			   }
            }
         }

         uint num_parse_jobs = LZHAM_MIN(m_num_parse_threads, (bytes_to_match + cMaxParseGraphNodes - 1) / cMaxParseGraphNodes);
         if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_DETERMINISTIC_PARSING) == 0)
         {
            if (m_use_task_pool && m_accel.get_max_helper_threads())
            {
               // Increase the number of active parse jobs as the match finder finishes up to keep CPU utilization up.
               num_parse_jobs += m_accel.get_num_completed_helper_threads();
               num_parse_jobs = LZHAM_MIN(num_parse_jobs, cMaxParseThreads);
            }
         }

         // Don't bother threading if the remaining bytes to parse is too small.
         if ((bytes_to_match < 1536) || (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING))
            num_parse_jobs = 1;

         // Update the coding statistics more frequently near the beginning of streams.
         if ((!m_block_index) && ((cur_dict_ofs - m_block_start_dict_ofs) < cMaxParseGraphNodes * 4))
            num_parse_jobs = 1;

         uint parse_thread_start_ofs = cur_dict_ofs;
         uint parse_thread_total_size = LZHAM_MIN(bytes_to_match, cMaxParseGraphNodes * num_parse_jobs);

         uint parse_thread_remaining = parse_thread_total_size;

         state_base saved_state;
         if (num_parse_jobs == 1)
            m_state.save_partial_state(saved_state);

         for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
         {
            parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

            if (num_parse_jobs == 1)
            {
               parse_thread.m_pState = &m_state;
            }
            else
            {
               parse_thread.m_pState = &parse_thread.m_state;
               parse_thread.m_state = m_state;
            }

            parse_thread.m_pState->m_cur_ofs = parse_thread_start_ofs;

            if (parse_thread_index > 0)
            {
               parse_thread.m_pState->reset_state_partial();
               parse_thread.m_issue_reset_state_partial = true;
            }
            else
            {
               parse_thread.m_issue_reset_state_partial = false;
            }

            parse_thread.m_start_ofs = parse_thread_start_ofs;
            if (parse_thread_index == (num_parse_jobs - 1))
               parse_thread.m_bytes_to_match = parse_thread_remaining;
            else
               parse_thread.m_bytes_to_match = parse_thread_total_size / num_parse_jobs;

            parse_thread.m_bytes_to_match = LZHAM_MIN(parse_thread.m_bytes_to_match, cMaxParseGraphNodes);
            LZHAM_ASSERT(parse_thread.m_bytes_to_match > 0);

            parse_thread.m_max_parse_node_states = m_params.m_extreme_parsing_max_best_arrivals;
            parse_thread.m_max_greedy_decisions = UINT_MAX;
            parse_thread.m_greedy_parse_gave_up = false;

            parse_thread.m_parse_early_out_thresh = UINT_MAX;
            parse_thread.m_bytes_actually_parsed = 0;

            parse_thread.m_use_semaphore = ((m_use_task_pool) && (num_parse_jobs > 1)) && (parse_thread_index > 0);

            if ((m_params.m_compression_level == cCompressionLevelUber) && (num_parse_jobs == 1))
            {
               // Allow the parsers to exit early if they encounter a graph bottleneck, so we can move the coding statistics forward before parsing again.
               parse_thread.m_parse_early_out_thresh = (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) ? 16 : 64;
            }

            parse_thread_start_ofs += parse_thread.m_bytes_to_match;
            parse_thread_remaining -= parse_thread.m_bytes_to_match;
         }

         {
            scoped_perf_section parse_timer("parsing");

            if ((m_use_task_pool) && (num_parse_jobs > 1))
            {
               {
                  scoped_perf_section queue_task_timer("queuing parse tasks");

                  if (!m_params.m_pTask_pool->queue_multiple_object_tasks(this, &lzcompressor::parse_job_callback, 1, num_parse_jobs - 1))
                     return false;
               }

               parse_job_callback(0, NULL);
            }
            else
            {
               for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
               {
                  parse_job_callback(parse_thread_index, NULL);
               }
            }
         }

         if (num_parse_jobs == 1)
            m_state.restore_partial_state(saved_state);

         if (!computed_adler32)
         {
            computed_adler32 = true;

            scoped_perf_section add_bytes_timer("adler32");
            m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);
         }

#define LZHAM_RELEASE_SEMAPHORES for (uint pti = 1; pti < num_parse_jobs; pti++) if (m_parse_thread_state[pti].m_use_semaphore) { m_parse_thread_state[pti].m_finished.wait(); m_parse_thread_state[pti].m_use_semaphore = false; }

         {
            scoped_perf_section coding_timer("coding");

            uint total_bytes_parsed = 0;

            for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
            {
               parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

               if (parse_thread.m_use_semaphore)
               {
                  scoped_perf_section sect(cVarArgs, "Waiting for parser %u", parse_thread_index);
                  m_parse_thread_state[parse_thread_index].m_finished.wait();
                  m_parse_thread_state[parse_thread_index].m_use_semaphore = false;
               }

               if (parse_thread.m_failed)
               {
                  LZHAM_RELEASE_SEMAPHORES
                  LZHAM_LOG_ERROR(7054);
                  return false;
               }

               const lzham::vector<lzdecision> &best_decisions = parse_thread.m_best_decisions;

               if (parse_thread.m_issue_reset_state_partial)
               {
                  if (!m_state.encode_reset_state_partial(m_codec, m_accel, cur_dict_ofs))
                  {
                     LZHAM_RELEASE_SEMAPHORES
                     LZHAM_LOG_ERROR(7055);
                     return false;
                  }
                  m_step++;
               }

               if (best_decisions.size())
               {
                  int i = 0;
                  int end_dec_index = static_cast<int>(best_decisions.size()) - 1;
                  int dec_step = 1;
                  if (parse_thread.m_emit_decisions_backwards)
                  {
                     i = static_cast<int>(best_decisions.size()) - 1;
                     end_dec_index = 0;
                     dec_step = -1;
                     LZHAM_ASSERT(best_decisions.back().m_pos == (int)parse_thread.m_start_ofs);
                  }
                  else
                  {
                     LZHAM_ASSERT(best_decisions.front().m_pos == (int)parse_thread.m_start_ofs);
                  }

                  // Loop rearranged to avoid bad x64 codegen problem with MSVC2008.
                  for ( ; ; )
                  {
                     LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                     LZHAM_ASSERT(i >= 0);
                     LZHAM_ASSERT(i < (int)best_decisions.size());

#if LZHAM_UPDATE_STATS
                     bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                     m_stats.update(best_decisions[i], m_state, m_accel, cost);
                     //m_state.print(m_codec, *this, m_accel, best_decisions[i]);
#endif

                     if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                     {
                        LZHAM_RELEASE_SEMAPHORES
                        LZHAM_LOG_ERROR(7056);
                        return false;
                     }

                     total_bytes_parsed += best_decisions[i].get_len();

                     if (i == end_dec_index)
                        break;
                     i += dec_step;
                  }

                  LZHAM_NOTE_UNUSED(i);
               }

               LZHAM_ASSERT(cur_dict_ofs == parse_thread.m_start_ofs + parse_thread.m_bytes_actually_parsed);

            } // parse_thread_index

            m_accel.advance_bytes(total_bytes_parsed);

         } // coding

      } // while (bytes_to_match)

      {
         scoped_perf_section add_bytes_timer("add_bytes_end");
         m_accel.add_bytes_end();
      }

      if (!m_state.encode_eob(m_codec, m_accel, cur_dict_ofs))
      {
         LZHAM_LOG_ERROR(7057);
         return false;
      }

#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(366, 12))
      {
         LZHAM_LOG_ERROR(7058);
         return false;
      }
#endif

      {
         scoped_perf_section stop_encoding_timer("stop_encoding");
         if (!m_codec.stop_encoding(true))
         {
            LZHAM_LOG_ERROR(7059);
            return false;
         }
      }

      // Coded the entire block - now see if it makes more sense to just send a raw/uncompressed block.

      uint compressed_size = m_codec.get_encoding_buf().size();
      LZHAM_NOTE_UNUSED(compressed_size);

      //bool used_raw_block = false;

#if !LZHAM_FORCE_ALL_RAW_BLOCKS
   #if (defined(LZHAM_DISABLE_RAW_BLOCKS) || defined(LZHAM_LZDEBUG))
       if (0)
   #else
       // TODO: Allow the user to control this threshold, i.e. if less than 1% then just store uncompressed.
       if (compressed_size >= buf_len)
   #endif
#endif
      {
         // Failed to compress the block, so go back to our original state and just code a raw block.
         m_state = m_start_of_block_state;
         m_step = initial_step;
         //m_stats = initial_stats;

         m_codec.reset();

         if (!m_codec.start_encoding(buf_len + 16))
         {
            LZHAM_LOG_ERROR(7060);
            return false;
         }

         if (!m_block_index)
         {
            if (!send_configuration())
            {
               LZHAM_LOG_ERROR(7061);
               return false;
            }
         }

#ifdef LZHAM_LZDEBUG
         if (!m_codec.encode_bits(166, 12))
         {
            LZHAM_LOG_ERROR(7062);
            return false;
         }
#endif

         if (!m_codec.encode_bits(cRawBlock, cBlockHeaderBits))
         {
            LZHAM_LOG_ERROR(7063);
            return false;
         }

         LZHAM_ASSERT(buf_len <= 0x1000000);
         if (!m_codec.encode_bits(buf_len - 1, 24))
         {
            LZHAM_LOG_ERROR(7064);
            return false;
         }

         // Write buf len check bits, to help increase the probability of detecting corrupted data more early.
         uint buf_len0 = (buf_len - 1) & 0xFF;
         uint buf_len1 = ((buf_len - 1) >> 8) & 0xFF;
         uint buf_len2 = ((buf_len - 1) >> 16) & 0xFF;
         if (!m_codec.encode_bits((buf_len0 ^ buf_len1) ^ buf_len2, 8))
         {
            LZHAM_LOG_ERROR(7065);
            return false;
         }

         if (!m_codec.encode_align_to_byte())
         {
            LZHAM_LOG_ERROR(7066);
            return false;
         }

         const uint8* pSrc = m_accel.get_ptr(m_block_start_dict_ofs);

         for (uint i = 0; i < buf_len; i++)
         {
            if (!m_codec.encode_bits(*pSrc++, 8))
            {
               LZHAM_LOG_ERROR(7067);
               return false;
            }
         }

         if (!m_codec.stop_encoding(true))
         {
            LZHAM_LOG_ERROR(7068);
            return false;
         }

         //used_raw_block = true;
         emit_reset_update_rate_command = false;
      }

      {
         scoped_perf_section append_timer("append");

         if (m_comp_buf.empty())
         {
            m_comp_buf.swap(m_codec.get_encoding_buf());
         }
         else
         {
            if (!m_comp_buf.append(m_codec.get_encoding_buf()))
            {
               LZHAM_LOG_ERROR(7069);
               return false;
            }
         }
      }

#if LZHAM_UPDATE_STATS
      LZHAM_VERIFY(m_stats.m_total_bytes == m_src_size);
      if (emit_reset_update_rate_command)
         m_stats.m_total_update_rate_resets++;
#endif

      m_block_index++;

      return true;
   }